

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_26::printSummaryRow
          (anon_unknown_26 *this,ostream *stream,ColourImpl *colour,StringRef label,
          vector<Catch::(anonymous_namespace)::SummaryColumn,_std::allocator<Catch::(anonymous_namespace)::SummaryColumn>_>
          *cols,size_t row)

{
  undefined8 *puVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  char *pcVar5;
  char local_61;
  ColourGuard local_60;
  ColourGuard local_50;
  ColourImpl *local_40;
  char *local_38;
  
  local_38 = label.m_start;
  puVar4 = *(undefined8 **)label.m_size;
  puVar1 = (undefined8 *)((long *)label.m_size)[1];
  local_40 = colour;
  if (puVar4 != puVar1) {
    do {
      pcVar5 = (char *)(puVar4[6] + (long)cols * 0x20);
      if (puVar4[1] == 0) {
        poVar3 = (ostream *)std::ostream::write((char *)this,(long)local_40);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        iVar2 = std::__cxx11::string::compare(pcVar5);
        if (iVar2 == 0) {
          local_60.m_code = BrightYellow;
          local_60.m_engaged = false;
          local_60.m_colourImpl = (ColourImpl *)stream;
          ColourImpl::ColourGuard::engageImpl(&local_60,(ostream *)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"- none -",8);
          if (local_60.m_engaged == true) {
            (*(local_60.m_colourImpl)->_vptr_ColourImpl[2])(local_60.m_colourImpl,0);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,*(char **)pcVar5,*(long *)(pcVar5 + 8));
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare(pcVar5);
        if (iVar2 != 0) {
          local_60.m_code = FileName;
          local_60.m_engaged = false;
          local_60.m_colourImpl = (ColourImpl *)stream;
          ColourImpl::ColourGuard::engageImpl(&local_60,(ostream *)this);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," | ",3);
          local_50.m_code = *(Code *)(puVar4 + 4);
          local_50.m_engaged = false;
          local_50.m_colourImpl = (ColourImpl *)stream;
          ColourImpl::ColourGuard::engageImpl(&local_50,(ostream *)this);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)this,*(char **)pcVar5,*(long *)(pcVar5 + 8));
          local_61 = ' ';
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_61,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)*puVar4,puVar4[1]);
          if (local_50.m_engaged == true) {
            (*(local_50.m_colourImpl)->_vptr_ColourImpl[2])(local_50.m_colourImpl,0);
          }
          if (local_60.m_engaged == true) {
            (*(local_60.m_colourImpl)->_vptr_ColourImpl[2])(local_60.m_colourImpl,0);
          }
        }
      }
      puVar4 = puVar4 + 9;
    } while (puVar4 != puVar1);
  }
  local_60.m_colourImpl = (ColourImpl *)CONCAT71(local_60.m_colourImpl._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_60,1);
  return;
}

Assistant:

void printSummaryRow( std::ostream& stream,
                              ColourImpl& colour,
                              StringRef label,
                              std::vector<SummaryColumn> const& cols,
                              std::size_t row ) {
            for ( auto const& col : cols ) {
                auto const& value = col.getRow( row );
                auto const& suffix = col.getSuffix();
                if ( suffix.empty() ) {
                    stream << label << ": ";
                    if ( value != "0" ) {
                        stream << value;
                    } else {
                        stream << colour.guardColour( Colour::Warning )
                               << "- none -";
                    }
                } else if ( value != "0" ) {
                    stream << colour.guardColour( Colour::LightGrey ) << " | "
                           << colour.guardColour( col.getColour() ) << value
                           << ' ' << suffix;
                }
            }
            stream << '\n';
        }